

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O3

void handle_result(uv_fs_t *req)

{
  uint64_t uVar1;
  uint64_t uVar2;
  int iVar3;
  uv_fs_t *unaff_RBX;
  undefined8 in_R9;
  uv_fs_t stat_req;
  uv_fs_t uStack_1d8;
  
  if (req->fs_type == UV_FS_COPYFILE) {
    unaff_RBX = req;
    if (req->result != 0) goto LAB_0014dc8c;
    iVar3 = uv_fs_stat((uv_loop_t *)0x0,&uStack_1d8,req->path,(uv_fs_cb)0x0);
    uVar2 = uStack_1d8.statbuf.st_size;
    uVar1 = uStack_1d8.statbuf.st_mode;
    if (iVar3 != 0) goto LAB_0014dc91;
    uv_fs_req_cleanup(&uStack_1d8);
    iVar3 = uv_fs_stat((uv_loop_t *)0x0,&uStack_1d8,"test_file_dst",(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0014dc96;
    if (uStack_1d8.statbuf.st_size == uVar2) {
      if (uStack_1d8.statbuf.st_mode == uVar1) {
        uv_fs_req_cleanup(&uStack_1d8);
        uv_fs_req_cleanup(req);
        result_check_count = result_check_count + 1;
        return;
      }
      goto LAB_0014dca0;
    }
  }
  else {
    handle_result_cold_1();
LAB_0014dc8c:
    handle_result_cold_2();
LAB_0014dc91:
    handle_result_cold_3();
LAB_0014dc96:
    handle_result_cold_4();
  }
  handle_result_cold_5();
LAB_0014dca0:
  handle_result_cold_6();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
          ,0x2a,"fail_cb should not have been called",in_R9,unaff_RBX);
  fflush(_stderr);
  abort();
}

Assistant:

static void handle_result(uv_fs_t* req) {
  uv_fs_t stat_req;
  uint64_t size;
  uint64_t mode;
  int r;

  ASSERT(req->fs_type == UV_FS_COPYFILE);
  ASSERT(req->result == 0);

  /* Verify that the file size and mode are the same. */
  r = uv_fs_stat(NULL, &stat_req, req->path, NULL);
  ASSERT(r == 0);
  size = stat_req.statbuf.st_size;
  mode = stat_req.statbuf.st_mode;
  uv_fs_req_cleanup(&stat_req);
  r = uv_fs_stat(NULL, &stat_req, dst, NULL);
  ASSERT(r == 0);
  ASSERT(stat_req.statbuf.st_size == size);
  ASSERT(stat_req.statbuf.st_mode == mode);
  uv_fs_req_cleanup(&stat_req);
  uv_fs_req_cleanup(req);
  result_check_count++;
}